

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingTable.cpp
# Opt level: O2

bool __thiscall Trie::findLongestPrefix(Trie *this,char *text,size_t *result)

{
  pointer pNVar1;
  iterator iVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  LookupEntry lookupEntry;
  key_type local_40;
  
  p_Var3 = (_Base_ptr)0x0;
  p_Var4 = (_Base_ptr)0x0;
  for (; local_40.input = *text, local_40.input != '\0'; text = text + 1) {
    if ((this->nodes).super__Vector_base<Trie::Node,_std::allocator<Trie::Node>_>._M_impl.
        super__Vector_impl_data._M_start[(long)p_Var3].hasValue != false) {
      p_Var4 = p_Var3;
    }
    local_40.node = (size_t)p_Var3;
    iVar2 = std::
            _Rb_tree<Trie::LookupEntry,_std::pair<const_Trie::LookupEntry,_unsigned_long>,_std::_Select1st<std::pair<const_Trie::LookupEntry,_unsigned_long>_>,_std::less<Trie::LookupEntry>,_std::allocator<std::pair<const_Trie::LookupEntry,_unsigned_long>_>_>
            ::find(&(this->lookup)._M_t,&local_40);
    if ((_Rb_tree_header *)iVar2._M_node == &(this->lookup)._M_t._M_impl.super__Rb_tree_header)
    break;
    p_Var3 = iVar2._M_node[1]._M_left;
  }
  pNVar1 = (this->nodes).super__Vector_base<Trie::Node,_std::allocator<Trie::Node>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pNVar1[(long)p_Var3].hasValue != false) {
    p_Var4 = p_Var3;
  }
  *result = pNVar1[(long)p_Var4].value;
  return pNVar1[(long)p_Var4].hasValue;
}

Assistant:

bool Trie::findLongestPrefix(const char* text, size_t& result)
{
	size_t node = 0;		// root node
	size_t valueNode = 0;	// remember last node that had a value

	while (*text != 0)
	{
		if (nodes[node].hasValue)
			valueNode = node;

		LookupEntry lookupEntry { node, *text++ };
		auto it = lookup.find(lookupEntry);
		
		if (it == lookup.end())
			break;

		node = it->second;
	}
	
	if (nodes[node].hasValue)
		valueNode = node;

	result = nodes[valueNode].value;
	return nodes[valueNode].hasValue;
}